

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobal.cpp
# Opt level: O0

uint qt_int_sqrt(uint n)

{
  uint uVar1;
  uint in_EDI;
  uint r;
  uint q;
  uint p;
  uint h;
  uint r2;
  uint r_1;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint in_stack_fffffffffffffff0;
  uint local_4;
  
  if (in_EDI < 0x3fffffff) {
    local_18 = 0;
    for (local_1c = 1; local_20 = in_EDI, local_1c <= in_EDI; local_1c = local_1c << 2) {
    }
    while (local_1c != 1) {
      local_1c = local_1c >> 2;
      uVar1 = local_18 + local_1c;
      local_18 = local_18 >> 1;
      if (uVar1 <= local_20) {
        local_18 = local_1c + local_18;
        local_20 = local_20 - uVar1;
      }
    }
    local_4 = local_18;
  }
  else {
    local_24 = qt_int_sqrt(in_stack_fffffffffffffff0);
    local_24 = local_24 * 2;
    uVar1 = local_24 + 1;
    if (uVar1 * uVar1 <= in_EDI) {
      local_24 = uVar1;
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

Q_CORE_EXPORT Q_DECL_CONST_FUNCTION unsigned int qt_int_sqrt(unsigned int n)
{
    // n must be in the range 0...UINT_MAX/2-1
    if (n >= (UINT_MAX >> 2)) {
        unsigned int r = 2 * qt_int_sqrt(n / 4);
        unsigned int r2 = r + 1;
        return (n >= r2 * r2) ? r2 : r;
    }
    uint h, p = 0, q = 1, r = n;
    while (q <= n)
        q <<= 2;
    while (q != 1) {
        q >>= 2;
        h = p + q;
        p >>= 1;
        if (r >= h) {
            p += q;
            r -= h;
        }
    }
    return p;
}